

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIASound.cpp
# Opt level: O0

void __thiscall Atari2600::TIASound::set_divider(TIASound *this,int channel,uint8_t divider)

{
  AsyncTaskQueue<false,_true,_void> *this_00;
  anon_class_16_3_bd65b95d local_48;
  function<void_()> local_38;
  uint8_t local_15;
  int local_14;
  uint8_t divider_local;
  TIASound *pTStack_10;
  int channel_local;
  TIASound *this_local;
  
  this_00 = this->audio_queue_;
  local_48.this = this;
  local_48.channel = channel;
  local_48.divider = divider;
  local_15 = divider;
  local_14 = channel;
  pTStack_10 = this;
  std::function<void()>::function<Atari2600::TIASound::set_divider(int,unsigned_char)::__0,void>
            ((function<void()> *)&local_38,&local_48);
  Concurrency::AsyncTaskQueue<false,_true,_void>::enqueue(this_00,&local_38);
  std::function<void_()>::~function(&local_38);
  return;
}

Assistant:

void Atari2600::TIASound::set_divider(int channel, uint8_t divider) {
	audio_queue_.enqueue([this, channel, divider]() {
		divider_[channel] = divider & 0x1f;
		divider_counter_[channel] = 0;
	});
}